

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileLlvmSwitch(LlvmCompilationContext *ctx,ExprSwitch *node)

{
  LLVMBuilderRef pLVar1;
  LLVMBasicBlockRef pLVar2;
  int iVar3;
  bool bVar4;
  LLVMBasicBlockRefOpaque **ppLVar5;
  LLVMValueRef pLVar6;
  TypeBase *type;
  LLVMTypeRef pLVar7;
  LLVMValueRef pLVar8;
  LLVMBasicBlockRef local_278;
  LLVMBasicBlockRef local_248;
  LLVMBasicBlockRef local_1d0;
  ExprBase *local_1b8;
  ExprBase *curr_3;
  LLVMValueRef local_1a0;
  LLVMValueRef condition;
  ExprBase *curr_2;
  LLVMBasicBlockRef pLStack_188;
  uint i;
  LLVMBasicBlockRef exitBlock;
  LLVMBasicBlockRef defaultBlock;
  ExprBase *local_170;
  ExprBase *curr_1;
  ExprBase *local_160;
  ExprBase *curr;
  undefined1 local_148 [8];
  SmallArray<LLVMBasicBlockRefOpaque_*,_16U> caseBlocks;
  SmallArray<LLVMBasicBlockRefOpaque_*,_16U> conditionBlocks;
  ExprSwitch *node_local;
  LlvmCompilationContext *ctx_local;
  
  CompileLlvm(ctx,node->condition);
  SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::SmallArray
            ((SmallArray<LLVMBasicBlockRefOpaque_*,_16U> *)&caseBlocks.allocator,ctx->allocator);
  SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::SmallArray
            ((SmallArray<LLVMBasicBlockRefOpaque_*,_16U> *)local_148,ctx->allocator);
  for (local_160 = (node->cases).head; local_160 != (ExprBase *)0x0; local_160 = local_160->next) {
    curr_1 = (ExprBase *)
             LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"switch_case");
    SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::push_back
              ((SmallArray<LLVMBasicBlockRefOpaque_*,_16U> *)&caseBlocks.allocator,
               (LLVMBasicBlockRefOpaque **)&curr_1);
  }
  for (local_170 = (node->blocks).head; local_170 != (ExprBase *)0x0; local_170 = local_170->next) {
    defaultBlock = LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"case_block");
    SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::push_back
              ((SmallArray<LLVMBasicBlockRefOpaque_*,_16U> *)local_148,&defaultBlock);
  }
  exitBlock = LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"default_block");
  pLStack_188 = LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"switch_exit");
  pLVar1 = ctx->builder;
  bVar4 = SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::empty
                    ((SmallArray<LLVMBasicBlockRefOpaque_*,_16U> *)&caseBlocks.allocator);
  if (bVar4) {
    local_1d0 = exitBlock;
  }
  else {
    ppLVar5 = SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::operator[]
                        ((SmallArray<LLVMBasicBlockRefOpaque_*,_16U> *)&caseBlocks.allocator,0);
    local_1d0 = *ppLVar5;
  }
  LLVMBuildBr(pLVar1,local_1d0);
  curr_2._4_4_ = 0;
  for (condition = (LLVMValueRef)(node->cases).head; condition != (LLVMValueRef)0x0;
      condition = *(LLVMValueRef *)(condition + 0x20)) {
    pLVar1 = ctx->builder;
    ppLVar5 = SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::operator[]
                        ((SmallArray<LLVMBasicBlockRefOpaque_*,_16U> *)&caseBlocks.allocator,
                         curr_2._4_4_);
    LLVMPositionBuilderAtEnd(pLVar1,*ppLVar5);
    pLVar6 = CompileLlvm(ctx,(ExprBase *)condition);
    iVar3 = LLVMIntNE;
    pLVar1 = ctx->builder;
    local_1a0 = pLVar6;
    type = GetStackType(ctx,*(TypeBase **)(condition + 0x18));
    pLVar7 = CompileLlvmType(ctx,type);
    pLVar8 = LLVMConstInt(pLVar7,0,true);
    pLVar6 = LLVMBuildICmp(pLVar1,iVar3,pLVar6,pLVar8,"");
    pLVar1 = ctx->builder;
    local_1a0 = pLVar6;
    ppLVar5 = SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::operator[]
                        ((SmallArray<LLVMBasicBlockRefOpaque_*,_16U> *)local_148,curr_2._4_4_);
    pLVar2 = *ppLVar5;
    if (*(long *)(condition + 0x20) == 0) {
      local_248 = exitBlock;
    }
    else {
      ppLVar5 = SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::operator[]
                          ((SmallArray<LLVMBasicBlockRefOpaque_*,_16U> *)&caseBlocks.allocator,
                           curr_2._4_4_ + 1);
      local_248 = *ppLVar5;
    }
    LLVMBuildCondBr(pLVar1,pLVar6,pLVar2,local_248);
    curr_2._4_4_ = curr_2._4_4_ + 1;
  }
  LlvmCompilationContext::LoopInfo::LoopInfo((LoopInfo *)&curr_3,pLStack_188,(LLVMBasicBlockRef)0x0)
  ;
  SmallArray<LlvmCompilationContext::LoopInfo,_32U>::push_back(&ctx->loopInfo,(LoopInfo *)&curr_3);
  curr_2._4_4_ = 0;
  for (local_1b8 = (node->blocks).head; local_1b8 != (ExprBase *)0x0; local_1b8 = local_1b8->next) {
    pLVar1 = ctx->builder;
    ppLVar5 = SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::operator[]
                        ((SmallArray<LLVMBasicBlockRefOpaque_*,_16U> *)local_148,curr_2._4_4_);
    LLVMPositionBuilderAtEnd(pLVar1,*ppLVar5);
    CompileLlvm(ctx,local_1b8);
    pLVar1 = ctx->builder;
    if (local_1b8->next == (ExprBase *)0x0) {
      local_278 = exitBlock;
    }
    else {
      ppLVar5 = SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::operator[]
                          ((SmallArray<LLVMBasicBlockRefOpaque_*,_16U> *)local_148,curr_2._4_4_ + 1)
      ;
      local_278 = *ppLVar5;
    }
    LLVMBuildBr(pLVar1,local_278);
    curr_2._4_4_ = curr_2._4_4_ + 1;
  }
  LLVMPositionBuilderAtEnd(ctx->builder,exitBlock);
  if (node->defaultBlock != (ExprBase *)0x0) {
    CompileLlvm(ctx,node->defaultBlock);
  }
  LLVMBuildBr(ctx->builder,pLStack_188);
  LLVMPositionBuilderAtEnd(ctx->builder,pLStack_188);
  SmallArray<LlvmCompilationContext::LoopInfo,_32U>::pop_back(&ctx->loopInfo);
  pLVar6 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)0x0);
  SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::~SmallArray
            ((SmallArray<LLVMBasicBlockRefOpaque_*,_16U> *)local_148);
  SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::~SmallArray
            ((SmallArray<LLVMBasicBlockRefOpaque_*,_16U> *)&caseBlocks.allocator);
  return pLVar6;
}

Assistant:

LLVMValueRef CompileLlvmSwitch(LlvmCompilationContext &ctx, ExprSwitch *node)
{
	CompileLlvm(ctx, node->condition);

	SmallArray<LLVMBasicBlockRef, 16> conditionBlocks(ctx.allocator);
	SmallArray<LLVMBasicBlockRef, 16> caseBlocks(ctx.allocator);

	// Generate blocks for all cases
	for(ExprBase *curr = node->cases.head; curr; curr = curr->next)
		conditionBlocks.push_back(LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "switch_case"));

	// Generate blocks for all cases
	for(ExprBase *curr = node->blocks.head; curr; curr = curr->next)
		caseBlocks.push_back(LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "case_block"));

	LLVMBasicBlockRef defaultBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "default_block");
	LLVMBasicBlockRef exitBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "switch_exit");

	LLVMBuildBr(ctx.builder, conditionBlocks.empty() ? defaultBlock : conditionBlocks[0]);

	unsigned i;

	// Generate code for all conditions
	i = 0;
	for(ExprBase *curr = node->cases.head; curr; curr = curr->next, i++)
	{
		LLVMPositionBuilderAtEnd(ctx.builder, conditionBlocks[i]);

		LLVMValueRef condition = CompileLlvm(ctx, curr);

		condition = LLVMBuildICmp(ctx.builder, LLVMIntNE, condition, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, curr->type)), 0, true), "");

		LLVMBuildCondBr(ctx.builder, condition, caseBlocks[i], curr->next ? conditionBlocks[i + 1] : defaultBlock);
	}

	ctx.loopInfo.push_back(LlvmCompilationContext::LoopInfo(exitBlock, NULL));

	// Generate code for all cases
	i = 0;
	for(ExprBase *curr = node->blocks.head; curr; curr = curr->next, i++)
	{
		LLVMPositionBuilderAtEnd(ctx.builder, caseBlocks[i]);

		CompileLlvm(ctx, curr);

		LLVMBuildBr(ctx.builder, curr->next ? caseBlocks[i + 1] : defaultBlock);
	}

	// Create default block
	LLVMPositionBuilderAtEnd(ctx.builder, defaultBlock);

	if(node->defaultBlock)
		CompileLlvm(ctx, node->defaultBlock);

	LLVMBuildBr(ctx.builder, exitBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, exitBlock);

	ctx.loopInfo.pop_back();

	return CheckType(ctx, node, NULL);
}